

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O0

void kratos::EventRemoval::process_block(StmtBlock *block)

{
  bool bVar1;
  StatementType SVar2;
  AuxiliaryType AVar3;
  element_type *this;
  element_type *this_00;
  reference psVar4;
  shared_ptr<kratos::Stmt> *stmt_1;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *__range2;
  shared_ptr<kratos::AuxiliaryStmt> aux;
  undefined1 local_50 [24];
  shared_ptr<kratos::Stmt> *stmt;
  uint64_t i;
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  stmts_to_remove;
  uint64_t stmt_count;
  StmtBlock *block_local;
  
  stmts_to_remove.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)StmtBlock::size(block);
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
         &i);
  for (stmt = (shared_ptr<kratos::Stmt> *)0x0;
      stmt < stmts_to_remove.
             super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
      stmt = (shared_ptr<kratos::Stmt> *)
             ((long)&(stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1
             )) {
    StmtBlock::get_stmt((StmtBlock *)local_50,(uint64_t)block);
    local_50._16_8_ = local_50;
    this = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_50._16_8_);
    SVar2 = Stmt::type(this);
    if (SVar2 == Auxiliary) {
      std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 local_50._16_8_);
      Stmt::as<kratos::AuxiliaryStmt>((Stmt *)&__range2);
      this_00 = std::
                __shared_ptr_access<kratos::AuxiliaryStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<kratos::AuxiliaryStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&__range2);
      AVar3 = AuxiliaryStmt::aux_type(this_00);
      if (AVar3 == EventTracing) {
        std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
        emplace_back<std::shared_ptr<kratos::Stmt>const&>
                  ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                    *)&i,(shared_ptr<kratos::Stmt> *)local_50._16_8_);
      }
      std::shared_ptr<kratos::AuxiliaryStmt>::~shared_ptr
                ((shared_ptr<kratos::AuxiliaryStmt> *)&__range2);
    }
    std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)local_50);
  }
  __end2 = std::
           vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
           begin((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  *)&i);
  stmt_1 = (shared_ptr<kratos::Stmt> *)
           std::
           vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
           end((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                *)&i);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                                *)&stmt_1);
    if (!bVar1) break;
    psVar4 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
             ::operator*(&__end2);
    (*(block->super_Stmt).super_IRNode._vptr_IRNode[10])(block,psVar4);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
    ::operator++(&__end2);
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          &i);
  return;
}

Assistant:

static void process_block(StmtBlock *block) {
        auto stmt_count = block->size();
        std::vector<std::shared_ptr<Stmt>> stmts_to_remove;
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto const &stmt = block->get_stmt(i);
            if (stmt->type() == StatementType::Auxiliary) {
                auto aux = stmt->as<AuxiliaryStmt>();
                if (aux->aux_type() == AuxiliaryType::EventTracing)
                    stmts_to_remove.emplace_back(stmt);
            }
        }
        for (auto const &stmt : stmts_to_remove) {
            block->remove_stmt(stmt);
        }
    }